

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O0

off_t qc_file_tell(QcFile *file)

{
  off_t off;
  QcFile *file_local;
  
  if (file == (QcFile *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
            ,0xa0);
    __assert_fail("file",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                  ,0xa0,"off_t qc_file_tell(QcFile *)");
  }
  file_local = (QcFile *)lseek(file->filedes,0,1);
  if ((long)file_local < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
              ,0xa5,"file tell failed");
    file_local = (QcFile *)0xffffffffffffffff;
  }
  return (off_t)file_local;
}

Assistant:

off_t qc_file_tell(QcFile *file)
{
    off_t off;

    qc_assert(file);

    off = lseek(file->filedes, 0, SEEK_CUR);
    if(off < 0)
    {
        qc_error("file tell failed");
        return -1;
    }

    return off;
}